

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::AddRect(ImDrawList *this,ImVec2 *p_min,ImVec2 *p_max,ImU32 col,float rounding,
                   ImDrawCornerFlags rounding_corners,float thickness)

{
  ImVec2 IVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  ImVec2 local_20;
  ImVec2 local_18;
  
  if (0xffffff < col) {
    if ((this->Flags & 1) == 0) {
      auVar2._0_4_ = (*p_min).x + 0.5;
      auVar2._4_4_ = (*p_min).y + 0.5;
      auVar2._8_4_ = 0x3f000000;
      auVar2._12_4_ = 0x3f000000;
      local_18 = (ImVec2)vmovlps_avx(auVar2);
      IVar1 = *p_max;
      fVar8 = -0.49;
      fVar5 = -0.49;
      fVar6 = -0.49;
      fVar7 = -0.49;
    }
    else {
      auVar3._0_4_ = (*p_min).x + 0.5;
      auVar3._4_4_ = (*p_min).y + 0.5;
      auVar3._8_4_ = 0x3f000000;
      auVar3._12_4_ = 0x3f000000;
      local_18 = (ImVec2)vmovlps_avx(auVar3);
      IVar1 = *p_max;
      fVar8 = -0.5;
      fVar5 = -0.5;
      fVar6 = -0.5;
      fVar7 = -0.5;
    }
    auVar4._0_4_ = IVar1.x + fVar5;
    auVar4._4_4_ = IVar1.y + fVar6;
    auVar4._8_4_ = fVar7 + 0.0;
    auVar4._12_4_ = fVar8 + 0.0;
    local_20 = (ImVec2)vmovlps_avx(auVar4);
    PathRect(this,&local_18,&local_20,rounding,rounding_corners);
    AddPolyline(this,(this->_Path).Data,(this->_Path).Size,col,true,thickness);
    (this->_Path).Size = 0;
  }
  return;
}

Assistant:

void ImDrawList::AddRect(const ImVec2& p_min, const ImVec2& p_max, ImU32 col, float rounding, ImDrawCornerFlags rounding_corners, float thickness)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;
    if (Flags & ImDrawListFlags_AntiAliasedLines)
        PathRect(p_min + ImVec2(0.50f, 0.50f), p_max - ImVec2(0.50f, 0.50f), rounding, rounding_corners);
    else
        PathRect(p_min + ImVec2(0.50f, 0.50f), p_max - ImVec2(0.49f, 0.49f), rounding, rounding_corners); // Better looking lower-right corner and rounded non-AA shapes.
    PathStroke(col, true, thickness);
}